

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O1

void __thiscall CCountryFlags::LoadCountryflagsIndexfile(CCountryFlags *this)

{
  IStorage *pIVar1;
  json_object_entry *pjVar2;
  IGraphics *pIVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  char *pcVar7;
  json_value *value;
  _json_value *p_Var8;
  _func_int **pp_Var9;
  _json_value *p_Var10;
  CCountryFlag *pCVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  IConsole *pIVar16;
  ulong uVar17;
  CCountryFlag *pCVar18;
  _json_value *p_Var19;
  long in_FS_OFFSET;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  plain_range_sorted<CCountryFlags::CCountryFlag> range;
  CImageInfo Info;
  json_settings JsonSettings;
  char aMsg [64];
  CCountryFlag CountryFlag;
  char aBuf [64];
  char aError [256];
  undefined1 auVar25 [16];
  _json_value *local_248;
  long local_240;
  uint local_220;
  uint local_21c;
  uint local_218;
  void *local_210;
  json_settings local_208;
  char local_1d8 [76];
  CCountryFlag local_18c;
  char local_178 [64];
  char local_138 [256];
  long local_38;
  IOHANDLE io;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pStorage;
  auVar25 = (undefined1  [16])0x0;
  iVar4 = (*(pIVar1->super_IInterface)._vptr_IInterface[4])
                    (pIVar1,"countryflags/index.json",1,0xffffffff,0,0,(undefined1  [16])0x0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar4);
  if (io == (IOHANDLE)0x0) {
    pIVar16 = ((this->super_CComponent).m_pClient)->m_pConsole;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*(pIVar16->super_IInterface)._vptr_IInterface[0x19])
                (pIVar16,1,"countryflags","couldn\'t open index file",0);
      return;
    }
  }
  else {
    lVar6 = io_length(io);
    uVar15 = (uint)lVar6;
    pcVar7 = (char *)mem_alloc(uVar15);
    io_read(io,pcVar7,uVar15);
    io_close(io);
    mem_zero(&local_208,0x30);
    value = json_parse_ex(&local_208,pcVar7,(long)(int)uVar15,local_138);
    mem_free(pcVar7);
    if (value == (json_value *)0x0) {
      pIVar16 = ((this->super_CComponent).m_pClient)->m_pConsole;
      (*(pIVar16->super_IInterface)._vptr_IInterface[0x19])
                (pIVar16,1,"countryflags/index.json",local_138,0);
    }
    else {
      local_248 = &json_value_none;
      if ((value->type == json_object) && (uVar13 = (ulong)(value->u).string.length, uVar13 != 0)) {
        pjVar2 = (value->u).object.values;
        lVar6 = 0;
        do {
          iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"country codes");
          if (iVar4 == 0) {
            local_248 = *(_json_value **)((long)&pjVar2->value + lVar6);
            break;
          }
          lVar6 = lVar6 + 0x18;
        } while (uVar13 * 0x18 != lVar6);
      }
      if (local_248->type == json_object) {
        local_240 = 0;
        do {
          p_Var19 = &json_value_none;
          if (local_248->type == json_object) {
            uVar13 = (ulong)(local_248->u).string.length;
            p_Var19 = &json_value_none;
            if (uVar13 != 0) {
              iVar4 = *(int *)(&DAT_001db768 + local_240 * 4);
              pjVar2 = (local_248->u).object.values;
              lVar6 = 0;
              do {
                iVar5 = strcmp(*(char **)((long)&pjVar2->name + lVar6),&DAT_001db768 + iVar4);
                if (iVar5 == 0) {
                  p_Var19 = *(_json_value **)((long)&pjVar2->value + lVar6);
                  goto LAB_0013f201;
                }
                lVar6 = lVar6 + 0x18;
              } while (uVar13 * 0x18 != lVar6);
              p_Var19 = &json_value_none;
            }
          }
LAB_0013f201:
          if ((p_Var19->type == json_array) && ((p_Var19->u).boolean != 0)) {
            uVar13 = 0;
            do {
              bVar21 = p_Var19->type == json_array;
              iVar4 = (int)uVar13;
              bVar20 = uVar13 < (p_Var19->u).string.length;
              p_Var10 = &json_value_none;
              if (bVar20 && (-1 < iVar4 && bVar21)) {
                p_Var10 = *(_json_value **)((p_Var19->u).string.ptr + uVar13 * 8);
              }
              p_Var8 = &json_value_none;
              if (p_Var10->type == json_object) {
                uVar17 = (ulong)(p_Var10->u).string.length;
                p_Var8 = &json_value_none;
                if (uVar17 != 0) {
                  pjVar2 = (p_Var10->u).object.values;
                  lVar6 = 0;
                  do {
                    iVar5 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"code");
                    if (iVar5 == 0) {
                      p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar6);
                      goto LAB_0013f2a8;
                    }
                    lVar6 = lVar6 + 0x18;
                  } while (uVar17 * 0x18 != lVar6);
                  p_Var8 = &json_value_none;
                }
              }
LAB_0013f2a8:
              if (p_Var8->type == json_double) {
                uVar17 = (ulong)(p_Var8->u).dbl;
              }
              else if (p_Var8->type == json_integer) {
                uVar17 = (p_Var8->u).integer;
              }
              else {
                uVar17 = 0;
              }
              if ((int)uVar17 - 1000U < 0xfffffc17) {
                str_format(local_178,0x40,"country code \'%i\' not within valid code range [%i..%i]"
                           ,uVar17 & 0xffffffff,0xffffffff,999);
                pIVar16 = ((this->super_CComponent).m_pClient)->m_pConsole;
                pp_Var9 = (pIVar16->super_IInterface)._vptr_IInterface;
LAB_0013f5d6:
                (*pp_Var9[0x19])(pIVar16,1,"countryflags",local_178);
              }
              else {
                p_Var10 = &json_value_none;
                if (bVar20 && (-1 < iVar4 && bVar21)) {
                  p_Var10 = *(_json_value **)((p_Var19->u).string.ptr + uVar13 * 8);
                }
                p_Var8 = &json_value_none;
                if (p_Var10->type == json_object) {
                  uVar12 = (ulong)(p_Var10->u).string.length;
                  p_Var8 = &json_value_none;
                  if (uVar12 != 0) {
                    pjVar2 = (p_Var10->u).object.values;
                    lVar6 = 0;
                    do {
                      iVar5 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"id");
                      if (iVar5 == 0) {
                        p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar6);
                        goto LAB_0013f395;
                      }
                      lVar6 = lVar6 + 0x18;
                    } while (uVar12 * 0x18 != lVar6);
                    p_Var8 = &json_value_none;
                  }
                }
LAB_0013f395:
                pcVar7 = "";
                if (p_Var8->type == json_string) {
                  pcVar7 = (p_Var8->u).string.ptr;
                }
                local_18c.m_Texture.m_Id = -1;
                local_18c.m_CountryCode = (int)uVar17;
                str_copy(local_18c.m_aCountryCodeString,pcVar7,8);
                if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClLoadCountryFlags == 0) {
LAB_0013f4d0:
                  local_18c.m_Blocked = false;
                  p_Var10 = &json_value_none;
                  if (((-1 < iVar4) && (p_Var10 = &json_value_none, p_Var19->type == json_array)) &&
                     (p_Var10 = &json_value_none, uVar13 < (p_Var19->u).string.length)) {
                    p_Var10 = *(_json_value **)((p_Var19->u).string.ptr + uVar13 * 8);
                  }
                  p_Var8 = &json_value_none;
                  if (p_Var10->type == json_object) {
                    uVar17 = (ulong)(p_Var10->u).string.length;
                    p_Var8 = &json_value_none;
                    if (uVar17 != 0) {
                      pjVar2 = (p_Var10->u).object.values;
                      lVar6 = 0;
                      do {
                        iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar6),"blocked");
                        if (iVar4 == 0) {
                          p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar6);
                          goto LAB_0013f55e;
                        }
                        lVar6 = lVar6 + 0x18;
                      } while (uVar17 * 0x18 != lVar6);
                      p_Var8 = &json_value_none;
                    }
                  }
LAB_0013f55e:
                  if ((p_Var8->type == json_boolean) && ((p_Var8->u).boolean != 0)) {
                    local_18c.m_Blocked = true;
                  }
                  array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  ::add(&(this->m_aCountryFlags).
                         super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                        ,&local_18c);
                  if (((this->super_CComponent).m_pClient)->m_pConfig->m_Debug != 0) {
                    str_format(local_178,0x40,"loaded country flag \'%s\'",pcVar7);
                    pIVar16 = ((this->super_CComponent).m_pClient)->m_pConsole;
                    pp_Var9 = (pIVar16->super_IInterface)._vptr_IInterface;
                    goto LAB_0013f5d6;
                  }
                }
                else {
                  str_format(local_178,0x40,"countryflags/%s.png");
                  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                  iVar5 = (*(pIVar3->super_IInterface)._vptr_IInterface[0xe])
                                    (pIVar3,&local_220,local_178,0xffffffff);
                  if (iVar5 != 0) {
                    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                    auVar24._12_4_ = 0;
                    auVar24._0_12_ = auVar25._4_12_;
                    auVar25 = auVar24 << 0x20;
                    local_18c.m_Texture.m_Id =
                         (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])
                                   (pIVar3,(ulong)local_220,(ulong)local_21c,(ulong)local_218,
                                    local_210,(ulong)local_218,auVar25);
                    mem_free(local_210);
                    goto LAB_0013f4d0;
                  }
                  str_format(local_1d8,0x40,"failed to load \'%s\'",local_178);
                  pIVar16 = ((this->super_CComponent).m_pClient)->m_pConsole;
                  (*(pIVar16->super_IInterface)._vptr_IInterface[0x19])
                            (pIVar16,1,"countryflags",local_1d8,0);
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < (p_Var19->u).string.length);
          }
          bVar20 = local_240 == 0;
          local_240 = local_240 + 1;
        } while (bVar20);
      }
      json_value_free(value);
      lVar6 = (long)(this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .num_elements;
      if (0 < lVar6) {
        pCVar11 = (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .list;
        range.super_plain_range<CCountryFlags::CCountryFlag>.end = pCVar11 + lVar6;
        range.super_plain_range<CCountryFlags::CCountryFlag>.begin = pCVar11;
        sort<plain_range_sorted<CCountryFlags::CCountryFlag>>(range);
      }
      lVar6 = (long)(this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .num_elements;
      if (0 < lVar6) {
        pCVar18 = (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .list;
        pCVar11 = pCVar18 + lVar6;
        iVar4 = 0;
        do {
          dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                         ,0x96,1,"empty");
          if (pCVar18->m_CountryCode == -1) goto LAB_0013f690;
          dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                         ,0x94,(uint)(pCVar18 < pCVar11),"empty");
          pCVar18 = pCVar18 + 1;
          iVar4 = iVar4 + 1;
        } while (pCVar18 < pCVar11);
      }
      iVar4 = 0;
LAB_0013f690:
      auVar25 = _DAT_001d6390;
      if (iVar4 == 0) {
        mem_zero(this->m_CodeIndexLUT,0xfa4);
      }
      else {
        lVar6 = 0xb;
        auVar22 = _DAT_001d9d10;
        auVar23 = _DAT_001d6f30;
        do {
          auVar24 = auVar23 ^ auVar25;
          if (auVar24._4_4_ == -0x80000000 && auVar24._0_4_ < -0x7ffffc17) {
            this->m_CodeIndexLUT[lVar6 + -0xb] = iVar4;
            this->m_CodeIndexLUT[lVar6 + -10] = iVar4;
          }
          auVar24 = auVar22 ^ auVar25;
          if (auVar24._4_4_ == -0x80000000 && auVar24._0_4_ < -0x7ffffc17) {
            this->m_CodeIndexLUT[lVar6 + -9] = iVar4;
            this->m_CodeIndexLUT[lVar6 + -8] = iVar4;
          }
          lVar14 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 4;
          auVar23._8_8_ = lVar14 + 4;
          lVar14 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 4;
          auVar22._8_8_ = lVar14 + 4;
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0x3f7);
      }
      lVar6 = (long)(this->m_aCountryFlags).
                    super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                    .num_elements;
      if (0 < lVar6) {
        pCVar11 = (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .list;
        lVar14 = 0;
        do {
          uVar15 = pCVar11->m_CountryCode + ((pCVar11->m_CountryCode + 1) / 0x3e9) * -0x3e9 + 1;
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          this->m_CodeIndexLUT[uVar15] = (int)lVar14;
          lVar14 = lVar14 + 1;
          pCVar11 = pCVar11 + 1;
        } while (lVar6 != lVar14);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CCountryFlags::LoadCountryflagsIndexfile()
{
	// read file data into buffer
	const char *pFilename = "countryflags/index.json";
	IOHANDLE File = Storage()->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", "couldn't open index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract data
	const json_value &rInit = (*pJsonData)["country codes"];
	if(rInit.type == json_object)
	{
		enum
		{
			NUM_INDICES = 2,
		};
		const char *paIndices[NUM_INDICES] = {"custom", "ISO 3166-1"};
		for(int Index = 0; Index < NUM_INDICES; ++Index)
		{
			const json_value &rStart = rInit[(const char *)paIndices[Index]];
			if(rStart.type == json_array)
			{
				for(unsigned i = 0; i < rStart.u.array.length; ++i)
				{
					char aBuf[64];

					// validate country code
					int CountryCode = (json_int_t)rStart[i]["code"];
					if(CountryCode < CODE_LB || CountryCode > CODE_UB)
					{
						str_format(aBuf, sizeof(aBuf), "country code '%i' not within valid code range [%i..%i]", CountryCode, CODE_LB, CODE_UB);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
						continue;
					}

					// add entry
					const char *pCountryName = rStart[i]["id"];
					CCountryFlag CountryFlag;
					CountryFlag.m_CountryCode = CountryCode;
					str_copy(CountryFlag.m_aCountryCodeString, pCountryName, sizeof(CountryFlag.m_aCountryCodeString));
					if(Config()->m_ClLoadCountryFlags)
					{
						// load the graphic file
						CImageInfo Info;
						str_format(aBuf, sizeof(aBuf), "countryflags/%s.png", pCountryName);
						if(!Graphics()->LoadPNG(&Info, aBuf, IStorage::TYPE_ALL))
						{
							char aMsg[64];
							str_format(aMsg, sizeof(aMsg), "failed to load '%s'", aBuf);
							Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aMsg);
							continue;
						}
						CountryFlag.m_Texture = Graphics()->LoadTextureRaw(Info.m_Width, Info.m_Height, Info.m_Format, Info.m_pData, Info.m_Format, 0);
						mem_free(Info.m_pData);
					}
					// blocked?
					CountryFlag.m_Blocked = false;
					const json_value Check = rStart[i]["blocked"];
					if(Check.type == json_boolean && Check)
						CountryFlag.m_Blocked = true;
					m_aCountryFlags.add_unsorted(CountryFlag);

					// print message
					if(Config()->m_Debug)
					{
						str_format(aBuf, sizeof(aBuf), "loaded country flag '%s'", pCountryName);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
					}
				}
			}
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_aCountryFlags.sort_range();

	// find index of default item
	int DefaultIndex = 0, Index = 0;
	for(sorted_array<CCountryFlag>::range r = m_aCountryFlags.all(); !r.empty(); r.pop_front(), ++Index)
		if(r.front().m_CountryCode == -1)
		{
			DefaultIndex = Index;
			break;
		}

	// init LUT
	if(DefaultIndex != 0)
		for(int i = 0; i < CODE_RANGE; ++i)
			m_CodeIndexLUT[i] = DefaultIndex;
	else
		mem_zero(m_CodeIndexLUT, sizeof(m_CodeIndexLUT));
	for(int i = 0; i < m_aCountryFlags.size(); ++i)
		m_CodeIndexLUT[maximum(0, (m_aCountryFlags[i].m_CountryCode-CODE_LB)%CODE_RANGE)] = i;
}